

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

TreeOrError * __thiscall
slang::syntax::SyntaxTree::fromFiles
          (TreeOrError *__return_storage_ptr__,SyntaxTree *this,
          span<const_std::basic_string_view<char,_std::char_traits<char>_>,_18446744073709551615UL>
          paths,SourceManager *sourceManager,Bag *options)

{
  undefined8 uVar1;
  char *pcVar2;
  __extent_storage<18446744073709551615UL> this_00;
  long lVar3;
  __extent_storage<18446744073709551615UL> _Var4;
  span<const_slang::SourceBuffer,_18446744073709551615UL> sources;
  MacroList inheritedMacros;
  basic_string_view<char,_std::char_traits<char>_> path;
  BufferOrError buffer;
  path local_f0;
  SmallVector<slang::SourceBuffer,_4UL> buffers;
  
  this_00 = paths._M_extent._M_extent_value;
  SmallVector<slang::SourceBuffer,_4UL>::SmallVector(&buffers,paths._M_ptr);
  lVar3 = 0;
  do {
    if ((long)paths._M_ptr << 4 == lVar3) {
      sources._M_extent._M_extent_value =
           (size_t)buffers.super_SmallVectorBase<slang::SourceBuffer>.data_;
      sources._M_ptr = (pointer)this_00._M_extent_value;
      inheritedMacros._M_extent._M_extent_value = 0;
      inheritedMacros._M_ptr = (pointer)sourceManager;
      create((SourceManager *)&buffer,sources,
             (Bag *)buffers.super_SmallVectorBase<slang::SourceBuffer>.len,inheritedMacros,false);
      uVar1 = buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
              m_value.data._M_str;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .m_has_value = true;
      buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.m_value.
      data._M_str = (char *)0x0;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
               m_value.data._M_len;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1;
      buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.m_value.
      data._M_len = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.
                  field_0.m_value.data._M_str);
LAB_001a7fe3:
      SmallVectorBase<slang::SourceBuffer>::cleanup
                (&buffers.super_SmallVectorBase<slang::SourceBuffer>,
                 (EVP_PKEY_CTX *)this_00._M_extent_value);
      return __return_storage_ptr__;
    }
    pcVar2 = (this->diagnosticsBuffer).super_SmallVector<slang::Diagnostic,_2UL>.
             super_SmallVectorBase<slang::Diagnostic>.firstElement + lVar3 + -0x48;
    path._M_len = *(size_t *)pcVar2;
    path._M_str = *(char **)(pcVar2 + 8);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_f0,&path,auto_format);
    _Var4._M_extent_value = this_00._M_extent_value;
    SourceManager::readSource
              (&buffer,(SourceManager *)this_00._M_extent_value,&local_f0,(SourceLibrary *)0x0,
               0xffffffffffffffff);
    std::filesystem::__cxx11::path::~path(&local_f0);
    if (buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.m_has_value ==
        false) {
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .m_has_value = false;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
               m_value.data._M_len;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_value.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           buffer.contained.super_storage_t_impl<slang::SourceBuffer,_std::error_code>.field_0.
           m_value.data._M_str;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_error.second._M_len = path._M_len;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<std::shared_ptr<slang::syntax::SyntaxTree>,_std::pair<std::error_code,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
      .field_0.m_error.second._M_str = path._M_str;
      this_00._M_extent_value = _Var4._M_extent_value;
      goto LAB_001a7fe3;
    }
    SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
              (&buffers.super_SmallVectorBase<slang::SourceBuffer>,(SourceBuffer *)&buffer);
    lVar3 = lVar3 + 0x10;
  } while( true );
}

Assistant:

SyntaxTree::TreeOrError SyntaxTree::fromFiles(std::span<const std::string_view> paths,
                                              SourceManager& sourceManager, const Bag& options) {
    SmallVector<SourceBuffer, 4> buffers(paths.size(), UninitializedTag());
    for (auto path : paths) {
        auto buffer = sourceManager.readSource(path, /* library */ nullptr);
        if (!buffer)
            return nonstd::make_unexpected(std::pair{buffer.error(), path});

        buffers.push_back(*buffer);
    }

    return create(sourceManager, buffers, options, {}, false);
}